

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::timestamp_t,duckdb::date_t,duckdb::UnaryOperatorWrapper,duckdb::Cast>
               (timestamp_t *ldata,date_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  timestamp_t tVar2;
  date_t *pdVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ValidityMask *pVVar11;
  unsigned_long uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  idx_t local_90;
  ValidityMask *local_88;
  date_t *local_80;
  ulong local_78;
  idx_t local_70;
  string local_68;
  ulong local_40;
  date_t *local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_88 = mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar8 = 0;
      do {
        tVar2.value = ldata[iVar8].value;
        bVar6 = TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>
                          (tVar2,(date_t *)&local_90,false);
        if (!bVar6) {
          auVar14 = __cxa_allocate_exception(0x10);
          CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
                    (&local_68,(duckdb *)tVar2.value,(timestamp_t)auVar14._8_8_);
          InvalidInputException::InvalidInputException(auVar14._0_8_,(string *)&local_68);
          __cxa_throw(auVar14._0_8_,&InvalidInputException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        result_data[iVar8].days = local_90._0_4_;
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
  }
  else {
    local_70 = count;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_90 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_90);
      sVar5 = local_68._M_string_length;
      _Var4._M_p = local_68._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var4._M_p;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      count = local_70;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_78 = count + 0x3f >> 6;
      local_40 = 0;
      uVar10 = 0;
      pVVar11 = local_88;
      local_80 = result_data;
      do {
        pdVar3 = local_80;
        puVar1 = (pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = puVar1[local_40];
        }
        uVar13 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar13 = count;
        }
        uVar9 = uVar13;
        if (uVar12 != 0) {
          uVar9 = uVar10;
          if (uVar12 == 0xffffffffffffffff) {
            if (uVar10 < uVar13) {
              do {
                tVar2.value = ldata[uVar10].value;
                bVar6 = TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>
                                  (tVar2,(date_t *)&local_90,false);
                if (!bVar6) {
                  auVar14 = __cxa_allocate_exception(0x10);
                  CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
                            (&local_68,(duckdb *)tVar2.value,(timestamp_t)auVar14._8_8_);
                  InvalidInputException::InvalidInputException(auVar14._0_8_,(string *)&local_68);
                  __cxa_throw(auVar14._0_8_,&InvalidInputException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                pdVar3[uVar10].days = local_90._0_4_;
                uVar10 = uVar10 + 1;
                uVar9 = uVar10;
              } while (uVar13 != uVar10);
            }
          }
          else {
            pVVar11 = local_88;
            if (uVar10 < uVar13) {
              local_38 = local_80 + uVar10;
              uVar9 = 0;
              do {
                if ((uVar12 >> (uVar9 & 0x3f) & 1) != 0) {
                  tVar2.value = ldata[uVar10 + uVar9].value;
                  bVar6 = TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>
                                    (tVar2,(date_t *)&local_90,false);
                  if (!bVar6) {
                    auVar14 = __cxa_allocate_exception(0x10);
                    CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
                              (&local_68,(duckdb *)tVar2.value,(timestamp_t)auVar14._8_8_);
                    InvalidInputException::InvalidInputException(auVar14._0_8_,(string *)&local_68);
                    __cxa_throw(auVar14._0_8_,&InvalidInputException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  local_38[uVar9].days = local_90._0_4_;
                }
                uVar9 = uVar9 + 1;
              } while ((uVar10 - uVar13) + uVar9 != 0);
              uVar9 = uVar10 + uVar9;
              pVVar11 = local_88;
            }
          }
        }
        local_40 = local_40 + 1;
        count = local_70;
        uVar10 = uVar9;
      } while (local_40 != local_78);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}